

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::DescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *failure_msg;
  void *pvVar3;
  int line;
  Arena *arena;
  Arena *arena_00;
  DescriptorProto *_this;
  DescriptorProto *local_30;
  MessageLite *local_28 [2];
  
  arena_00 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  local_30 = (DescriptorProto *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::DescriptorProto_const*,google::protobuf::DescriptorProto*>
                          ((DescriptorProto **)local_28,&local_30,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0x1139;
LAB_00c2af04:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::MergeFrom
            (&(local_30->field_0)._impl_.field_,
             (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
             &from_msg[1]._internal_metadata_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::MergeFrom
            (&(local_30->field_0)._impl_.nested_type_,
             (RepeatedPtrField<google::protobuf::DescriptorProto> *)(from_msg + 3));
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::MergeFrom
            (&(local_30->field_0)._impl_.enum_type_,
             (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
             &from_msg[4]._internal_metadata_);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::MergeFrom
            (&(local_30->field_0)._impl_.extension_range_,
             (RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)(from_msg + 6));
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::MergeFrom
            (&(local_30->field_0)._impl_.extension_,
             (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
             &from_msg[7]._internal_metadata_);
  RepeatedPtrField<google::protobuf::OneofDescriptorProto>::MergeFrom
            (&(local_30->field_0)._impl_.oneof_decl_,
             (RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)(from_msg + 9));
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::MergeFrom
            (&(local_30->field_0)._impl_.reserved_range_,
             (RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)
             &from_msg[10]._internal_metadata_);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_30->field_0)._impl_.reserved_name_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(from_msg + 0xc));
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      uVar2 = from_msg[0xd]._internal_metadata_.ptr_;
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 1;
      arena = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_30->field_0)._impl_.name_,(string *)(uVar2 & 0xfffffffffffffffc),arena);
    }
    if ((uVar1 & 2) != 0) {
      from_msg_00 = (MessageLite *)from_msg[0xe]._vptr_MessageLite;
      if (from_msg_00 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.options_ != nullptr";
        line = 0x1152;
        goto LAB_00c2af04;
      }
      to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 0xd0);
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar3 = Arena::CopyConstruct<google::protobuf::MessageOptions>(arena_00,from_msg_00);
        *(void **)((long)&local_30->field_0 + 0xd0) = pvVar3;
      }
      else {
        MessageOptions::MergeImpl(to_msg_00,from_msg_00);
      }
    }
    if ((uVar1 & 4) != 0) {
      *(int *)((long)&local_30->field_0 + 0xd8) = (int)from_msg[0xe]._internal_metadata_.ptr_;
    }
  }
  (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void DescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<DescriptorProto*>(&to_msg);
  auto& from = static_cast<const DescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.DescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_field()->MergeFrom(
      from._internal_field());
  _this->_internal_mutable_nested_type()->MergeFrom(
      from._internal_nested_type());
  _this->_internal_mutable_enum_type()->MergeFrom(
      from._internal_enum_type());
  _this->_internal_mutable_extension_range()->MergeFrom(
      from._internal_extension_range());
  _this->_internal_mutable_extension()->MergeFrom(
      from._internal_extension());
  _this->_internal_mutable_oneof_decl()->MergeFrom(
      from._internal_oneof_decl());
  _this->_internal_mutable_reserved_range()->MergeFrom(
      from._internal_reserved_range());
  _this->_internal_mutable_reserved_name()->MergeFrom(from._internal_reserved_name());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.visibility_ = from._impl_.visibility_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}